

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

bool FixBuildPalette(BYTE *opal,int lump,bool blood)

{
  int iVar1;
  byte *pbVar2;
  int c;
  FResourceFile **ppFVar3;
  byte bVar4;
  FMemLump data;
  FMemLump local_30;
  
  iVar1 = FWadCollection::LumpLength(&Wads,lump);
  if (0x2ff < iVar1) {
    FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffd0,0x1c6a4b0);
    ppFVar3 = (FResourceFile **)0x0;
    if (*(int *)((long)local_30.Block.Chars - 0xc) == 0) {
      local_30.Block.Chars = (FString)(FString)ppFVar3;
    }
    pbVar2 = (byte *)((long)local_30.Block.Chars + 0x2ff);
    for (; ppFVar3 < (FResourceFile **)0x300; ppFVar3 = (FResourceFile **)((long)ppFVar3 + 3)) {
      bVar4 = pbVar2[-2];
      if (blood) {
        opal[(long)ppFVar3] = bVar4;
        (opal + 1)[(long)ppFVar3] = pbVar2[-1];
        bVar4 = *pbVar2;
      }
      else {
        opal[(long)ppFVar3] = bVar4 >> 4 | bVar4 * '\x04';
        (opal + 1)[(long)ppFVar3] = pbVar2[-1] >> 4 | pbVar2[-1] * '\x04';
        bVar4 = *pbVar2 >> 4 | *pbVar2 * '\x04';
      }
      (opal + 2)[(long)ppFVar3] = bVar4;
      pbVar2 = pbVar2 + -3;
    }
    FMemLump::~FMemLump(&stack0xffffffffffffffd0);
  }
  return 0x2ff < iVar1;
}

Assistant:

static bool FixBuildPalette (BYTE *opal, int lump, bool blood)
{
	if (Wads.LumpLength (lump) < 768)
	{
		return false;
	}

	FMemLump data = Wads.ReadLump (lump);
	const BYTE *ipal = (const BYTE *)data.GetMem();
	
	// Reverse the palette because BUILD used entry 255 as
	// transparent, but we use 0 as transparent.

	for (int c = 0; c < 768; c += 3)
	{
		if (!blood)
		{
			opal[c] =	(ipal[765-c] << 2) | (ipal[765-c] >> 4);
			opal[c+1] = (ipal[766-c] << 2) | (ipal[766-c] >> 4);
			opal[c+2] = (ipal[767-c] << 2) | (ipal[767-c] >> 4);
		}
		else
		{
			opal[c] = ipal[765-c];
			opal[c+1] = ipal[766-c];
			opal[c+2] = ipal[767-c];
		}
	}
	return true;
}